

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O3

void __thiscall Omega_h::CmdLineArg<int>::~CmdLineArg(CmdLineArg<int> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_CmdLineItem)._vptr_CmdLineItem = (_func_int **)&PTR__CmdLineItem_004b8760;
  pcVar1 = (this->super_CmdLineItem).name_._M_dataplus._M_p;
  paVar2 = &(this->super_CmdLineItem).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

CmdLineItem::~CmdLineItem() {}